

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O2

void __thiscall
wasm::ToolOptions::ToolOptions(ToolOptions *this,string *command,string *description)

{
  string *psVar1;
  ToolOptions *pTVar2;
  _Any_data local_6f8;
  code *local_6e8;
  code *local_6e0;
  _Any_data local_6d8;
  code *local_6c8;
  code *local_6c0;
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  allocator<char> local_618 [32];
  allocator<char> local_5f8 [32];
  allocator<char> local_5d8 [32];
  allocator<char> local_5b8 [32];
  allocator<char> local_598 [32];
  allocator<char> local_578 [32];
  allocator<char> local_558 [32];
  allocator<char> local_538 [32];
  allocator<char> local_518 [32];
  allocator<char> local_4f8 [32];
  allocator<char> local_4d8 [32];
  allocator<char> local_4b8 [32];
  allocator<char> local_498 [32];
  allocator<char> local_478 [32];
  allocator<char> local_458 [32];
  allocator<char> local_438 [32];
  _Any_data local_418;
  code *local_408;
  code *local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *local_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  PassOptions *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  wasm::Options::Options(&this->super_Options,(string *)command,(string *)description);
  PassOptions::PassOptions(&this->passOptions);
  this->quiet = false;
  this->profile = Normal;
  this->enabledFeatures = 0x22;
  (this->disabledFeatures).features = 0;
  local_90 = &this->passOptions;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"--mvp-features",local_618);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"-mvp",(allocator<char> *)local_338._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"Disable all non-MVP features",local_5f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Tool options",local_5d8);
  local_3f8._8_8_ = 0;
  local_3e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:46:12)>
              ::_M_invoke;
  local_3e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:46:12)>
              ::_M_manager;
  local_3f8._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add((string *)this,(string *)&local_310,(string *)&local_2f0,
                              (string *)&local_2d0,(Arguments)&local_2b0,(function *)0x0,
                              SUB81(&local_3f8,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"--all-features",local_5b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"-all",local_598);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"Enable all features",(allocator<char> *)local_b0._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Tool options",local_578);
  local_3d8._8_8_ = 0;
  local_3c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:55:12)>
              ::_M_invoke;
  local_3c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:55:12)>
              ::_M_manager;
  local_3d8._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)&local_290,(string *)&local_270,(string *)&local_250,
                              (Arguments)&local_230,(function *)0x0,SUB81(&local_3d8,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"--detect-features",local_558);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"",local_538);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"(deprecated - this flag does nothing)",local_518);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Tool options",(allocator<char> *)local_378._M_pod_data);
  local_358._M_unused._M_object = (void *)0x0;
  local_358._8_8_ = 0;
  local_340 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:64:12)>
              ::_M_invoke;
  local_348 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:64:12)>
              ::_M_manager;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)&local_210,(string *)&local_1f0,(string *)&local_1d0,
                              (Arguments)&local_1b0,(function *)0x0,SUB81(&local_358,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"--quiet",local_4f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"-q",local_4d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"Emit less verbose output and hide trivial warnings.",local_4b8);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"Tool options",local_498);
  local_3b8._8_8_ = 0;
  local_3a0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:70:12)>
              ::_M_invoke;
  local_3a8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:70:12)>
              ::_M_manager;
  local_3b8._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)&local_190,(string *)&local_170,local_150,
                              (Arguments)local_130,(function *)0x0,SUB81(&local_3b8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"--experimental-poppy",(allocator<char> *)local_418._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88._M_pod_data,"",local_478);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"Parse wast files as Poppy IR for testing purposes.",local_458);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"Tool options",local_438);
  local_398._8_8_ = 0;
  local_380 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:77:9)>
              ::_M_invoke;
  local_388 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:77:9)>
              ::_M_manager;
  local_398._M_unused._M_object = this;
  wasm::Options::add(psVar1,local_110,(string *)local_88._M_pod_data,local_f0,(Arguments)local_d0,
                     (function *)0x0,SUB81(&local_398,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_398);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string((string *)local_88._M_pod_data);
  std::__cxx11::string::~string(local_110);
  std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::_Function_base::~_Function_base((_Function_base *)&local_358);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::_Function_base::~_Function_base((_Function_base *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::_Function_base::~_Function_base((_Function_base *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"sign extension operations",&local_5d);
  pTVar2 = addFeature(this,SignExt,&local_310);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"atomic operations",&local_5c);
  pTVar2 = addFeature(pTVar2,Atomics,&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"mutable globals",&local_5b);
  pTVar2 = addFeature(pTVar2,MutableGlobals,&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"nontrapping float-to-int operations",&local_5a);
  pTVar2 = addFeature(pTVar2,TruncSat,&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3f8._M_pod_data,"SIMD operations and types",&local_59);
  pTVar2 = addFeature(pTVar2,SIMD,(string *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"bulk memory operations",&local_58);
  pTVar2 = addFeature(pTVar2,BulkMemory,&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"exception handling operations",&local_57);
  pTVar2 = addFeature(pTVar2,ExceptionHandling,&local_270);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"tail call operations",&local_56);
  pTVar2 = addFeature(pTVar2,TailCall,&local_250);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"reference types",&local_55);
  pTVar2 = addFeature(pTVar2,ReferenceTypes,&local_230);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3d8._M_pod_data,"multivalue functions",&local_54);
  pTVar2 = addFeature(pTVar2,Multivalue,(string *)&local_3d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"garbage collection",&local_53);
  pTVar2 = addFeature(pTVar2,GC,&local_210);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"memory64",&local_52);
  pTVar2 = addFeature(pTVar2,Memory64,&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"GC non-null locals",&local_51);
  pTVar2 = addFeature(pTVar2,GCNNLocals,&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"relaxed SIMD",&local_50);
  pTVar2 = addFeature(pTVar2,RelaxedSIMD,&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_358._M_pod_data,"extended const expressions",&local_4f);
  pTVar2 = addFeature(pTVar2,ExtendedConst,(string *)&local_358);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"strings",&local_4e);
  pTVar2 = addFeature(pTVar2,Strings,&local_190);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"multi-memories",&local_4d);
  pTVar2 = addFeature(pTVar2,MultiMemories,&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            (local_150,"--enable-typed-function-references",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>(local_130,"",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3b8._M_pod_data,"Deprecated compatibility flag",&local_4a);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"Tool options",&local_49);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:102:12)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:102:12)>
             ::_M_manager;
  psVar1 = (string *)
           wasm::Options::add((string *)pTVar2,local_150,local_130,(string *)local_3b8._M_pod_data,
                              (Arguments)local_110,(function *)0x0,SUB81(&local_88,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"--disable-typed-function-references",&local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"",&local_47);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_398._M_pod_data,"Deprecated compatibility flag",&local_46);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_618,"Tool options",&local_45);
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_320 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:112:12)>
              ::_M_invoke;
  local_328 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:112:12)>
              ::_M_manager;
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_f0,local_d0,(string *)local_398._M_pod_data,
                              (Arguments)local_618,(function *)0x0,SUB81(&local_338,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5f8,"--no-validation",&local_44);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_5d8,"-n",&local_43);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5b8,"Disables validation, assumes inputs are correct",&local_42);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_598,"Tool options",&local_41);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:122:12)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:122:12)>
             ::_M_manager;
  local_b0._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)local_5f8,(string *)local_5d8,(string *)local_5b8,
                              (Arguments)local_598,(function *)0x0,SUB81(&local_b0,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_578,"--pass-arg",&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_558,"-pa",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_538,
             "An argument passed along to optimization passes being run. Must be in the form KEY@VALUE"
             ,&local_3e);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_518,"Tool options",&local_3d);
  local_378._8_8_ = 0;
  local_360 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:131:12)>
              ::_M_invoke;
  local_368 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:131:12)>
              ::_M_manager;
  local_378._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)local_578,(string *)local_558,(string *)local_538,
                              (Arguments)local_518,(function *)0x2,SUB81(&local_378,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4f8,"--nominal",&local_3c);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4d8,"",&local_3b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4b8,"Force all GC type definitions to be parsed as nominal.",&local_3a)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_498,"Tool options",&local_39);
  local_418._M_unused._M_object = (void *)0x0;
  local_418._8_8_ = 0;
  local_400 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:148:12)>
              ::_M_invoke;
  local_408 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:148:12)>
              ::_M_manager;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)local_4f8,(string *)local_4d8,(string *)local_4b8,
                              (Arguments)local_498,(function *)0x0,SUB81(&local_418,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_478,"--hybrid",&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_458,"",&local_37);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_438,
             "Force all GC type definitions to be parsed using the isorecursive hybrid type system."
             ,&local_36);
  std::__cxx11::string::string<std::allocator<char>>(local_6b8,"Tool options",&local_35);
  local_6d8._M_unused._M_object = (void *)0x0;
  local_6d8._8_8_ = 0;
  local_6c0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:157:12)>
              ::_M_invoke;
  local_6c8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:157:12)>
              ::_M_manager;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)local_478,(string *)local_458,(string *)local_438,
                              (Arguments)local_6b8,(function *)0x0,SUB81(&local_6d8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_698,"--closed-world",&local_34);
  std::__cxx11::string::string<std::allocator<char>>(local_678,"-cw",&local_33);
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,
             "Assume code outside of the module does not inspect or interact with GC and function references, even if they are passed out. The outside may hold on to them and pass them back in, but not inspect their contents or call them."
             ,&local_32);
  std::__cxx11::string::string<std::allocator<char>>(local_638,"Tool options",&local_31);
  local_6f8._8_8_ = 0;
  local_6e0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:169:9)>
              ::_M_invoke;
  local_6e8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/tool-options.h:169:9)>
              ::_M_manager;
  local_6f8._M_unused._M_object = this;
  wasm::Options::add(psVar1,local_698,local_678,local_658,(Arguments)local_638,(function *)0x0,
                     SUB81(&local_6f8,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_6f8);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_658);
  std::__cxx11::string::~string(local_678);
  std::__cxx11::string::~string(local_698);
  std::_Function_base::~_Function_base((_Function_base *)&local_6d8);
  std::__cxx11::string::~string(local_6b8);
  std::__cxx11::string::~string((string *)local_438);
  std::__cxx11::string::~string((string *)local_458);
  std::__cxx11::string::~string((string *)local_478);
  std::_Function_base::~_Function_base((_Function_base *)&local_418);
  std::__cxx11::string::~string((string *)local_498);
  std::__cxx11::string::~string((string *)local_4b8);
  std::__cxx11::string::~string((string *)local_4d8);
  std::__cxx11::string::~string((string *)local_4f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_378);
  std::__cxx11::string::~string((string *)local_518);
  std::__cxx11::string::~string((string *)local_538);
  std::__cxx11::string::~string((string *)local_558);
  std::__cxx11::string::~string((string *)local_578);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  std::__cxx11::string::~string((string *)local_598);
  std::__cxx11::string::~string((string *)local_5b8);
  std::__cxx11::string::~string((string *)local_5d8);
  std::__cxx11::string::~string((string *)local_5f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_338);
  std::__cxx11::string::~string((string *)local_618);
  std::__cxx11::string::~string((string *)local_398._M_pod_data);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string((string *)local_3b8._M_pod_data);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)local_358._M_pod_data);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)local_3d8._M_pod_data);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)local_3f8._M_pod_data);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  return;
}

Assistant:

ToolOptions(const std::string& command, const std::string& description)
    : Options(command, description) {
    (*this)
      .add("--mvp-features",
           "-mvp",
           "Disable all non-MVP features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setMVP();
             disabledFeatures.setAll();
           })
      .add("--all-features",
           "-all",
           "Enable all features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setAll();
             disabledFeatures.setMVP();
           })
      .add("--detect-features",
           "",
           "(deprecated - this flag does nothing)",
           ToolOptionsCategory,
           Arguments::Zero,
           [](Options*, const std::string&) {})
      .add("--quiet",
           "-q",
           "Emit less verbose output and hide trivial warnings.",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) { quiet = true; })
      .add(
        "--experimental-poppy",
        "",
        "Parse wast files as Poppy IR for testing purposes.",
        ToolOptionsCategory,
        Arguments::Zero,
        [this](Options*, const std::string&) { profile = IRProfile::Poppy; });
    (*this)
      .addFeature(FeatureSet::SignExt, "sign extension operations")
      .addFeature(FeatureSet::Atomics, "atomic operations")
      .addFeature(FeatureSet::MutableGlobals, "mutable globals")
      .addFeature(FeatureSet::TruncSat, "nontrapping float-to-int operations")
      .addFeature(FeatureSet::SIMD, "SIMD operations and types")
      .addFeature(FeatureSet::BulkMemory, "bulk memory operations")
      .addFeature(FeatureSet::ExceptionHandling,
                  "exception handling operations")
      .addFeature(FeatureSet::TailCall, "tail call operations")
      .addFeature(FeatureSet::ReferenceTypes, "reference types")
      .addFeature(FeatureSet::Multivalue, "multivalue functions")
      .addFeature(FeatureSet::GC, "garbage collection")
      .addFeature(FeatureSet::Memory64, "memory64")
      .addFeature(FeatureSet::GCNNLocals, "GC non-null locals")
      .addFeature(FeatureSet::RelaxedSIMD, "relaxed SIMD")
      .addFeature(FeatureSet::ExtendedConst, "extended const expressions")
      .addFeature(FeatureSet::Strings, "strings")
      .addFeature(FeatureSet::MultiMemories, "multi-memories")
      .add("--enable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --enable-typed-function-references is deprecated\n";
           })
      .add("--disable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --disable-typed-function-references is deprecated\n";
           })
      .add("--no-validation",
           "-n",
           "Disables validation, assumes inputs are correct",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string& argument) {
             passOptions.validate = false;
           })
      .add("--pass-arg",
           "-pa",
           "An argument passed along to optimization passes being run. Must be "
           "in the form KEY@VALUE",
           ToolOptionsCategory,
           Options::Arguments::N,
           [this](Options*, const std::string& argument) {
             std::string key, value;
             auto colon = argument.find('@');
             if (colon == std::string::npos) {
               key = argument;
               value = "1";
             } else {
               key = argument.substr(0, colon);
               value = argument.substr(colon + 1);
             }
             passOptions.arguments[key] = value;
           })
      .add("--nominal",
           "",
           "Force all GC type definitions to be parsed as nominal.",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             setTypeSystem(TypeSystem::Nominal);
           })
      .add("--hybrid",
           "",
           "Force all GC type definitions to be parsed using the isorecursive "
           "hybrid type system.",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             setTypeSystem(TypeSystem::Isorecursive);
           })
      .add(
        "--closed-world",
        "-cw",
        "Assume code outside of the module does not inspect or interact with "
        "GC and function references, even if they are passed out. The outside "
        "may hold on to them and pass them back in, but not inspect their "
        "contents or call them.",
        ToolOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.closedWorld = true;
        });
  }